

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_clnt.c
# Opt level: O2

CLIENT * local_rpcb(char *tag)

{
  int iVar1;
  u_int sendsz;
  size_t sVar2;
  CLIENT *clnt;
  char *pcVar3;
  void *handlep;
  netconfig *nconf;
  mem_format_t p_Var4;
  char *pcVar5;
  netconfig *local_c8;
  sockaddr_un sun;
  netbuf nbuf;
  
  sun.sun_path[0x5e] = '\0';
  sun.sun_path[0x5f] = '\0';
  sun.sun_path[0x60] = '\0';
  sun.sun_path[0x61] = '\0';
  sun.sun_path[0x62] = '\0';
  sun.sun_path[99] = '\0';
  sun.sun_path[100] = '\0';
  sun.sun_path[0x65] = '\0';
  sun.sun_path[0x66] = '\0';
  sun.sun_path[0x67] = '\0';
  sun.sun_path[0x68] = '\0';
  sun.sun_path[0x69] = '\0';
  sun.sun_path[0x6a] = '\0';
  sun.sun_path[0x6b] = '\0';
  sun.sun_path[0x4e] = '\0';
  sun.sun_path[0x4f] = '\0';
  sun.sun_path[0x50] = '\0';
  sun.sun_path[0x51] = '\0';
  sun.sun_path[0x52] = '\0';
  sun.sun_path[0x53] = '\0';
  sun.sun_path[0x54] = '\0';
  sun.sun_path[0x55] = '\0';
  sun.sun_path[0x56] = '\0';
  sun.sun_path[0x57] = '\0';
  sun.sun_path[0x58] = '\0';
  sun.sun_path[0x59] = '\0';
  sun.sun_path[0x5a] = '\0';
  sun.sun_path[0x5b] = '\0';
  sun.sun_path[0x5c] = '\0';
  sun.sun_path[0x5d] = '\0';
  sun.sun_path[0x3e] = '\0';
  sun.sun_path[0x3f] = '\0';
  sun.sun_path[0x40] = '\0';
  sun.sun_path[0x41] = '\0';
  sun.sun_path[0x42] = '\0';
  sun.sun_path[0x43] = '\0';
  sun.sun_path[0x44] = '\0';
  sun.sun_path[0x45] = '\0';
  sun.sun_path[0x46] = '\0';
  sun.sun_path[0x47] = '\0';
  sun.sun_path[0x48] = '\0';
  sun.sun_path[0x49] = '\0';
  sun.sun_path[0x4a] = '\0';
  sun.sun_path[0x4b] = '\0';
  sun.sun_path[0x4c] = '\0';
  sun.sun_path[0x4d] = '\0';
  sun.sun_path[0x2e] = '\0';
  sun.sun_path[0x2f] = '\0';
  sun.sun_path[0x30] = '\0';
  sun.sun_path[0x31] = '\0';
  sun.sun_path[0x32] = '\0';
  sun.sun_path[0x33] = '\0';
  sun.sun_path[0x34] = '\0';
  sun.sun_path[0x35] = '\0';
  sun.sun_path[0x36] = '\0';
  sun.sun_path[0x37] = '\0';
  sun.sun_path[0x38] = '\0';
  sun.sun_path[0x39] = '\0';
  sun.sun_path[0x3a] = '\0';
  sun.sun_path[0x3b] = '\0';
  sun.sun_path[0x3c] = '\0';
  sun.sun_path[0x3d] = '\0';
  sun.sun_path[0x1e] = '\0';
  sun.sun_path[0x1f] = '\0';
  sun.sun_path[0x20] = '\0';
  sun.sun_path[0x21] = '\0';
  sun.sun_path[0x22] = '\0';
  sun.sun_path[0x23] = '\0';
  sun.sun_path[0x24] = '\0';
  sun.sun_path[0x25] = '\0';
  sun.sun_path[0x26] = '\0';
  sun.sun_path[0x27] = '\0';
  sun.sun_path[0x28] = '\0';
  sun.sun_path[0x29] = '\0';
  sun.sun_path[0x2a] = '\0';
  sun.sun_path[0x2b] = '\0';
  sun.sun_path[0x2c] = '\0';
  sun.sun_path[0x2d] = '\0';
  sun.sun_path[0xe] = '\0';
  sun.sun_path[0xf] = '\0';
  sun.sun_path[0x10] = '\0';
  sun.sun_path[0x11] = '\0';
  sun.sun_path[0x12] = '\0';
  sun.sun_path[0x13] = '\0';
  sun.sun_path[0x14] = '\0';
  sun.sun_path[0x15] = '\0';
  sun.sun_path[0x16] = '\0';
  sun.sun_path[0x17] = '\0';
  sun.sun_path[0x18] = '\0';
  sun.sun_path[0x19] = '\0';
  sun.sun_path[0x1a] = '\0';
  sun.sun_path[0x1b] = '\0';
  sun.sun_path[0x1c] = '\0';
  sun.sun_path[0x1d] = '\0';
  sun.sun_family = 0;
  sun.sun_path[0] = '\0';
  sun.sun_path[1] = '\0';
  sun.sun_path[2] = '\0';
  sun.sun_path[3] = '\0';
  sun.sun_path[4] = '\0';
  sun.sun_path[5] = '\0';
  sun.sun_path[6] = '\0';
  sun.sun_path[7] = '\0';
  sun.sun_path[8] = '\0';
  sun.sun_path[9] = '\0';
  sun.sun_path[10] = '\0';
  sun.sun_path[0xb] = '\0';
  sun.sun_path[0xc] = '\0';
  sun.sun_path[0xd] = '\0';
  iVar1 = socket(1,1,0);
  if (iVar1 < 0) {
    clnt = clnt_raw_ncreate(100000,3);
  }
  else {
    sun.sun_family = 1;
    builtin_strncpy(sun.sun_path,"/var/run/rpcbind.sock",0x16);
    sVar2 = strlen(sun.sun_path);
    nbuf.len = (int)sVar2 + 2;
    nbuf.maxlen = 0x6e;
    nbuf.buf = &sun;
    sendsz = __rpc_get_t_size(1,0,0);
    clnt = clnt_vc_ncreatef(iVar1,&nbuf,100000,3,sendsz,sendsz,0x10000010);
    if ((clnt->cl_error).re_status == RPC_SUCCESS) {
      return clnt;
    }
    pcVar3 = rpc_sperror(&clnt->cl_error,tag);
    if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x80) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s",pcVar3);
    }
    (*__ntirpc_pkg_params.free_size_)(pcVar3,0x100);
    close(iVar1);
  }
  pthread_mutex_lock((pthread_mutex_t *)&loopnconf_lock);
  if (local_rpcb::loopnconf == (netconfig *)0x0) {
    handlep = setnetconfig();
    if (handlep == (void *)0x0) {
      syslog(3,"rpc: failed to open /etc/netconfig");
      pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
      p_Var4 = __ntirpc_pkg_params.warnx_;
      if (((byte)__ntirpc_pkg_params.debug_flags & 4) != 0) {
        pcVar3 = clnt_sperrno(RPC_UNKNOWNPROTO);
        pcVar5 = "%s(%s): failed to open /etc/netconfig %s";
LAB_0011205e:
        (*p_Var4)(pcVar5,"local_rpcb",tag,pcVar3);
      }
    }
    else {
      local_c8 = (netconfig *)0x0;
      while (nconf = getnetconfig(handlep), nconf != (netconfig *)0x0) {
        pcVar3 = nconf->nc_protofmly;
        iVar1 = strcmp(pcVar3,"inet6");
        if ((((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"inet"), iVar1 == 0)) &&
            ((nconf->nc_semantics & 0xfffffffffffffffe) == 2)) &&
           (iVar1 = __rpc_nconf2fd(nconf), -1 < iVar1)) {
          close(iVar1);
          iVar1 = strcmp(nconf->nc_protofmly,"inet");
          local_rpcb::hostname = "::1";
          local_c8 = nconf;
          if (iVar1 == 0) {
            local_rpcb::hostname = "127.0.0.1";
          }
        }
      }
      if (local_c8 != (netconfig *)0x0) {
        local_rpcb::loopnconf = getnetconfigent(local_c8->nc_netid);
        endnetconfig(handlep);
        goto LAB_00111ec3;
      }
      endnetconfig(handlep);
      pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
      p_Var4 = __ntirpc_pkg_params.warnx_;
      if (((byte)__ntirpc_pkg_params.debug_flags & 4) != 0) {
        pcVar3 = clnt_sperrno(RPC_UNKNOWNPROTO);
        pcVar5 = "%s(%s): failed to find /etc/netconfig %s";
        goto LAB_0011205e;
      }
    }
    (clnt->cl_error).re_status = RPC_UNKNOWNPROTO;
  }
  else {
LAB_00111ec3:
    pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
    clnt_destroy_it(clnt,"local_rpcb",0x568);
    clnt = getclnthandle(local_rpcb::hostname,local_rpcb::loopnconf,(char **)0x0);
  }
  return clnt;
}

Assistant:

static CLIENT *local_rpcb(const char *tag)
{
	CLIENT *client = NULL;
	char *t;
	static struct netconfig *loopnconf = NULL;
	static char *hostname;
	extern mutex_t loopnconf_lock;
	struct netbuf nbuf;
	struct sockaddr_un sun;
	size_t tsize;
	int sock;

	/*
	 * Try connecting to the local rpcbind through a local socket
	 * first. If this doesn't work, try all transports defined in
	 * the netconfig file.
	 */
	memset(&sun, 0, sizeof(sun));
	sock = socket(AF_LOCAL, SOCK_STREAM, 0);
	if (sock < 0) {
		/* For error codes */
		client = clnt_raw_ncreate(RPCBPROG, RPCBVERS);
		goto try_nconf;
	}
	sun.sun_family = AF_LOCAL;
	strcpy(sun.sun_path, _PATH_RPCBINDSOCK);
	nbuf.len = SUN_LEN(&sun);
	nbuf.maxlen = sizeof(struct sockaddr_un);
	nbuf.buf = &sun;

	tsize = __rpc_get_t_size(AF_LOCAL, 0, 0);
	client = clnt_vc_ncreatef(sock, &nbuf, (rpcprog_t) RPCBPROG,
				  (rpcvers_t) RPCBVERS, tsize, tsize,
				  CLNT_CREATE_FLAG_CLOSE |
				  CLNT_CREATE_FLAG_CONNECT);

	if (CLNT_SUCCESS(client)) {
		return client;
	}
	t = rpc_sperror(&client->cl_error, tag);

	__warnx(TIRPC_DEBUG_FLAG_CLNT_RPCB, "%s", t);
	mem_free(t, RPC_SPERROR_BUFLEN);

	/* Save client for error return */

	/* Nobody needs this socket anymore; free the descriptor. */
	close(sock);

 try_nconf:
	/* VARIABLES PROTECTED BY loopnconf_lock: loopnconf */
	mutex_lock(&loopnconf_lock);
	if (loopnconf == NULL) {
		struct netconfig *nconf, *tmpnconf = NULL;
		void *nc_handle;
		int fd;

		nc_handle = setnetconfig();
		if (nc_handle == NULL) {
			/* fails to open netconfig file */
			syslog(LOG_ERR, "rpc: failed to open " NETCONFIG);
			mutex_unlock(&loopnconf_lock);
			__warnx(TIRPC_DEBUG_FLAG_WARN,
				"%s(%s): failed to open " NETCONFIG " %s",
				__func__, tag, clnt_sperrno(RPC_UNKNOWNPROTO));
			client->cl_error.re_status = RPC_UNKNOWNPROTO;
			return (client);
		}
		while ((nconf = getnetconfig(nc_handle)) != NULL) {
#ifdef INET6
			if ((strcmp(nconf->nc_protofmly, NC_INET6) == 0 ||
#else
			if ((
#endif
				    strcmp(nconf->nc_protofmly, NC_INET) == 0)
			    && (nconf->nc_semantics == NC_TPI_COTS
				|| nconf->nc_semantics == NC_TPI_COTS_ORD)) {
				fd = __rpc_nconf2fd(nconf);
				/*
				 * Can't create a socket, assume that
				 * this family isn't configured in the kernel.
				 */
				if (fd < 0)
					continue;
				close(fd);
				tmpnconf = nconf;
				if (!strcmp(nconf->nc_protofmly, NC_INET))
					hostname = IN4_LOCALHOST_STRING;
				else
					hostname = IN6_LOCALHOST_STRING;
			}
		}
		if (tmpnconf == NULL) {
			endnetconfig(nc_handle);
			mutex_unlock(&loopnconf_lock);
			__warnx(TIRPC_DEBUG_FLAG_WARN,
				"%s(%s): failed to find " NETCONFIG " %s",
				__func__, tag, clnt_sperrno(RPC_UNKNOWNPROTO));
			client->cl_error.re_status = RPC_UNKNOWNPROTO;
			return (client);
		}
		loopnconf = getnetconfigent(tmpnconf->nc_netid);
		/* loopnconf is never freed */
		endnetconfig(nc_handle);
	}